

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

void __thiscall cppgenerate::Class::Class(Class *this,string *name)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->m_className)._M_dataplus._M_p = (pointer)&(this->m_className).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + name->_M_string_length);
  (this->m_namespace)._M_dataplus._M_p = (pointer)&(this->m_namespace).field_2;
  (this->m_namespace)._M_string_length = 0;
  (this->m_namespace).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_methods).super__Vector_base<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_methods).super__Vector_base<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_methods).super__Vector_base<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_memberVariables).
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_memberVariables).
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_memberVariables).
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_constructors).
  super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_constructors).
  super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_constructors).
  super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_parents).
  super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_parents).
  super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_parents).
  super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_documentation)._M_dataplus._M_p = (pointer)&(this->m_documentation).field_2;
  (this->m_documentation)._M_string_length = 0;
  (this->m_documentation).field_2._M_local_buf[0] = '\0';
  this->m_isQobject = false;
  return;
}

Assistant:

Class::Class( std::string name ) :
    m_className( name ),
    m_isQobject( false )
{}